

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<unsigned_short>>,std::tuple<std::__cxx11::string_const&,unsigned_short>>
               (tuple<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                *matchers,
               tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short>
               *values,ostream *os)

{
  element_type *peVar1;
  int iVar2;
  ostream *poVar3;
  type matcher;
  string local_1d0;
  StringMatchResultListener listener;
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<unsigned_short>>,std::tuple<std::__cxx11::string_const&,unsigned_short>>
            (matchers,values,os);
  Matcher<unsigned_short>::Matcher(&matcher,(Matcher<unsigned_short> *)matchers);
  StringMatchResultListener::StringMatchResultListener(&listener);
  iVar2 = (*((matcher.super_MatcherBase<unsigned_short>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (matcher.super_MatcherBase<unsigned_short>.impl_.
                     super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,values,&listener);
  if ((char)iVar2 == '\0') {
    poVar3 = std::operator<<(os,"  Expected arg #");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,": ");
    peVar1 = (matchers->
             super__Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
             ).super__Tuple_impl<1UL,_testing::Matcher<unsigned_short>_>.
             super__Head_base<1UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
             super_MatcherBase<unsigned_short>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*(peVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(peVar1,os);
    std::operator<<(os,"\n           Actual: ");
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<unsigned_short,void,std::ostream&>((unsigned_short *)values,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&listener);
  MatcherBase<unsigned_short>::~MatcherBase(&matcher.super_MatcherBase<unsigned_short>);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }